

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O2

int __thiscall Fl_Input_::linesPerPage(Fl_Input_ *this)

{
  int iVar1;
  int iVar2;
  
  if (((this->super_Fl_Widget).type_ & 7) == 4) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_);
    iVar2 = (this->super_Fl_Widget).h_;
    iVar1 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
    iVar2 = iVar2 / iVar1;
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

uchar type() const {return type_;}